

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O3

int __thiscall ncnn::Dequantize::forward_inplace(Dequantize *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  
  iVar2 = bottom_top_blob->dims;
  if (iVar2 == 3) {
    uVar3 = bottom_top_blob->c;
    uVar7 = bottom_top_blob->h * bottom_top_blob->w;
    if (this->bias_term == 0) {
      if (0 < (int)uVar3) {
        pvVar9 = bottom_top_blob->data;
        sVar5 = bottom_top_blob->elemsize;
        sVar6 = bottom_top_blob->cstep;
        uVar10 = 0;
        do {
          if (0 < (int)uVar7) {
            uVar8 = 0;
            do {
              *(float *)((long)pvVar9 + uVar8 * 4) =
                   (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
          uVar10 = uVar10 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar5 * sVar6);
        } while (uVar10 != uVar3);
      }
    }
    else if (0 < (int)uVar3) {
      pvVar9 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->elemsize;
      iVar2 = this->bias_data_size;
      sVar6 = bottom_top_blob->cstep;
      uVar10 = 0;
      do {
        uVar8 = 0;
        if (1 < iVar2) {
          uVar8 = uVar10;
        }
        if (0 < (int)uVar7) {
          fVar1 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
          uVar8 = 0;
          do {
            *(float *)((long)pvVar9 + uVar8 * 4) =
                 (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale + fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        uVar10 = uVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar5 * sVar6);
      } while (uVar10 != uVar3);
    }
  }
  else if (iVar2 == 2) {
    uVar3 = bottom_top_blob->w;
    uVar7 = bottom_top_blob->h;
    if (this->bias_term == 0) {
      if (0 < (int)uVar7) {
        pvVar9 = bottom_top_blob->data;
        uVar10 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar8 = 0;
            do {
              *(float *)((long)pvVar9 + uVar8 * 4) =
                   (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale;
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
          }
          uVar10 = uVar10 + 1;
          pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar3 * 4);
        } while (uVar10 != uVar7);
      }
    }
    else if (0 < (int)uVar7) {
      pvVar9 = bottom_top_blob->data;
      iVar2 = this->bias_data_size;
      uVar10 = 0;
      do {
        uVar8 = uVar10 & 0xffffffff;
        if (iVar2 < 2) {
          uVar8 = 0;
        }
        if (0 < (int)uVar3) {
          fVar1 = *(float *)((long)(this->bias_data).data + uVar8 * 4);
          uVar8 = 0;
          do {
            *(float *)((long)pvVar9 + uVar8 * 4) =
                 (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale + fVar1;
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        uVar10 = uVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar3 * 4);
      } while (uVar10 != uVar7);
    }
  }
  else if (iVar2 == 1) {
    uVar3 = bottom_top_blob->w;
    uVar10 = (ulong)uVar3;
    pvVar9 = bottom_top_blob->data;
    if (this->bias_term == 0) {
      if (0 < (int)uVar3) {
        uVar8 = 0;
        do {
          *(float *)((long)pvVar9 + uVar8 * 4) =
               (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
    }
    else if (this->bias_data_size < 2) {
      if (0 < (int)uVar3) {
        fVar1 = *(this->bias_data).data;
        uVar8 = 0;
        do {
          *(float *)((long)pvVar9 + uVar8 * 4) =
               (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale + fVar1;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
    }
    else if (0 < (int)uVar3) {
      pvVar4 = (this->bias_data).data;
      uVar8 = 0;
      do {
        *(float *)((long)pvVar9 + uVar8 * 4) =
             (float)*(int *)((long)pvVar9 + uVar8 * 4) * this->scale +
             *(float *)((long)pvVar4 + uVar8 * 4);
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        const int* intptr = bottom_top_blob;
        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            if (bias_data_size > 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
            else
            {
                float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i=0; i<w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                ptr[i] = intptr[i] * scale;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                float bias = bias_data_size > 1 ? bias_data[i] : bias_data[0];

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const int* intptr = bottom_top_blob.row<const int>(i);
                float* ptr = bottom_top_blob.row(i);

                for (int j=0; j<w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                float bias = bias_data_size > 1 ? bias_data[q] : bias_data[0];

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const int* intptr = bottom_top_blob.channel(q);
                float* ptr = bottom_top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
    }

    return 0;
}